

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMocker<bool_(long,_(anonymous_namespace)::TestValue_*)>::
UntypedPerformDefaultAction
          (FunctionMocker<bool_(long,_(anonymous_namespace)::TestValue_*)> *this,void *untyped_args,
          string *call_description)

{
  int iVar1;
  Result RVar2;
  UntypedActionResultHolderBase *pUVar3;
  OnCallSpec<bool_(long,_(anonymous_namespace)::TestValue_*)> *this_00;
  allocator<char> local_49;
  string local_48;
  
  pUVar3 = (UntypedActionResultHolderBase *)operator_new(0x10);
  this_00 = FindOnCallSpec(this,(ArgumentTuple *)untyped_args);
  if (this_00 == (OnCallSpec<bool_(long,_(anonymous_namespace)::TestValue_*)> *)0x0) {
    std::operator+(&local_48,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    RVar2 = DefaultValue<bool>::Get();
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    iVar1 = *(int *)(this_00 + 0xc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,".WillByDefault() must appear exactly once in an ON_CALL().",
               &local_49);
    UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this_00,iVar1 == 2,&local_48)
    ;
    std::__cxx11::string::~string((string *)&local_48);
    local_48._M_dataplus._M_p = *untyped_args;
    local_48._M_string_length = *(size_type *)((long)untyped_args + 8);
    RVar2 = Action<bool_(long,_(anonymous_namespace)::TestValue_*)>::Perform
                      ((Action<bool_(long,_(anonymous_namespace)::TestValue_*)> *)(this_00 + 0x58),
                       (ArgumentTuple *)&local_48);
  }
  pUVar3->_vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_00187410;
  *(Result *)&pUVar3[1]._vptr_UntypedActionResultHolderBase = RVar2;
  return pUVar3;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformDefaultAction(
      void* untyped_args,  // must point to an ArgumentTuple
      const std::string& call_description) const override {
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformDefaultAction(this, std::move(*args),
                                              call_description);
  }